

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qundogroup.cpp
# Opt level: O1

void QUndoGroup::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  long *plVar1;
  offset_in_QUndoGroup_to_subr *candidate;
  undefined4 uVar2;
  int iVar3;
  long in_FS_OFFSET;
  undefined8 local_30;
  void *local_28;
  undefined8 *puStack_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (_c == IndexOfMethod) {
    plVar1 = (long *)_a[1];
    if (((((((code *)*plVar1 == activeStackChanged) && (uVar2 = 0, plVar1[1] == 0)) ||
          (((code *)*plVar1 == indexChanged && (uVar2 = 1, plVar1[1] == 0)))) ||
         (((code *)*plVar1 == cleanChanged && (uVar2 = 2, plVar1[1] == 0)))) ||
        (((code *)*plVar1 == canUndoChanged && (uVar2 = 3, plVar1[1] == 0)))) ||
       (((((code *)*plVar1 == canRedoChanged && (uVar2 = 4, plVar1[1] == 0)) ||
         (((code *)*plVar1 == undoTextChanged && (uVar2 = 5, plVar1[1] == 0)))) ||
        (((code *)*plVar1 == redoTextChanged && (uVar2 = 6, plVar1[1] == 0)))))) {
      *(undefined4 *)*_a = uVar2;
    }
    goto LAB_0061591a;
  }
  if (_c != InvokeMetaMethod) goto LAB_0061591a;
  switch(_id) {
  case 0:
    local_30 = *_a[1];
    puStack_20 = &local_30;
    iVar3 = 0;
    break;
  case 1:
    puStack_20 = &local_30;
    local_30 = CONCAT44(local_30._4_4_,*_a[1]);
    iVar3 = 1;
    break;
  case 2:
    puStack_20 = &local_30;
    local_30 = CONCAT71(local_30._1_7_,*_a[1]);
    iVar3 = 2;
    break;
  case 3:
    puStack_20 = &local_30;
    local_30 = CONCAT71(local_30._1_7_,*_a[1]);
    iVar3 = 3;
    break;
  case 4:
    puStack_20 = &local_30;
    local_30 = CONCAT71(local_30._1_7_,*_a[1]);
    iVar3 = 4;
    break;
  case 5:
    puStack_20 = (undefined8 *)_a[1];
    iVar3 = 5;
    break;
  case 6:
    puStack_20 = (undefined8 *)_a[1];
    iVar3 = 6;
    break;
  case 7:
    if (*(QUndoStack **)(*(long *)(_o + 8) + 0x78) != (QUndoStack *)0x0) {
      QUndoStack::undo(*(QUndoStack **)(*(long *)(_o + 8) + 0x78));
    }
    goto LAB_0061591a;
  case 8:
    if (*(QUndoStack **)(*(long *)(_o + 8) + 0x78) != (QUndoStack *)0x0) {
      QUndoStack::redo(*(QUndoStack **)(*(long *)(_o + 8) + 0x78));
    }
    goto LAB_0061591a;
  case 9:
    setActiveStack((QUndoGroup *)_o,*_a[1]);
  default:
    goto LAB_0061591a;
  }
  local_28 = (void *)0x0;
  QMetaObject::activate(_o,&staticMetaObject,iVar3,&local_28);
LAB_0061591a:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QUndoGroup::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QUndoGroup *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->activeStackChanged((*reinterpret_cast< std::add_pointer_t<QUndoStack*>>(_a[1]))); break;
        case 1: _t->indexChanged((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 2: _t->cleanChanged((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 3: _t->canUndoChanged((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 4: _t->canRedoChanged((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 5: _t->undoTextChanged((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 6: _t->redoTextChanged((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 7: _t->undo(); break;
        case 8: _t->redo(); break;
        case 9: _t->setActiveStack((*reinterpret_cast< std::add_pointer_t<QUndoStack*>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QUndoGroup::*)(QUndoStack * )>(_a, &QUndoGroup::activeStackChanged, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QUndoGroup::*)(int )>(_a, &QUndoGroup::indexChanged, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QUndoGroup::*)(bool )>(_a, &QUndoGroup::cleanChanged, 2))
            return;
        if (QtMocHelpers::indexOfMethod<void (QUndoGroup::*)(bool )>(_a, &QUndoGroup::canUndoChanged, 3))
            return;
        if (QtMocHelpers::indexOfMethod<void (QUndoGroup::*)(bool )>(_a, &QUndoGroup::canRedoChanged, 4))
            return;
        if (QtMocHelpers::indexOfMethod<void (QUndoGroup::*)(const QString & )>(_a, &QUndoGroup::undoTextChanged, 5))
            return;
        if (QtMocHelpers::indexOfMethod<void (QUndoGroup::*)(const QString & )>(_a, &QUndoGroup::redoTextChanged, 6))
            return;
    }
}